

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

void fs_event_cb_close(uv_fs_event_t *handle,char *filename,int events,int status)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  eval_a = (int64_t)status;
  eval_b = 0;
  if (eval_a == 0) {
    eval_a = (int64_t)fs_event_cb_called;
    eval_b = 3;
    if (eval_a < 3) {
      fs_event_cb_called = fs_event_cb_called + 1;
      if (fs_event_cb_called == 3) {
        uv_close(handle,close_cb,CONCAT44(in_register_00000014,events));
        return;
      }
      return;
    }
    pcVar4 = "<";
    pcVar1 = "b + 3";
    pcVar3 = "fs_event_cb_called";
    uVar2 = 0x18c;
  }
  else {
    pcVar4 = "==";
    pcVar1 = "r < 0";
    pcVar3 = "status";
    uVar2 = 0x18a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
          ,uVar2,pcVar3,pcVar4,pcVar1 + 4,eval_a,pcVar4,eval_b);
  abort();
}

Assistant:

static void fs_event_cb_close(uv_fs_event_t* handle,
                              const char* filename,
                              int events,
                              int status) {
  ASSERT_OK(status);

  ASSERT_LT(fs_event_cb_called, 3);
  ++fs_event_cb_called;

  if (fs_event_cb_called == 3) {
    uv_close((uv_handle_t*) handle, close_cb);
  }
}